

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_service_processor(t_lua_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  t_service *ptVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  _Alloc_hider _Var6;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string classname;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  pcVar5 = "Processor";
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar3),"Processor");
  ptVar2 = tservice->extends_;
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  std::operator<<(poVar4," = __TObject.new(");
  if (ptVar2 == (t_service *)0x0) {
    pcVar5 = "__TProcessor";
    poVar4 = out;
  }
  else {
    iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    poVar4 = std::operator<<(out,(string *)CONCAT44(extraout_var_00,iVar3));
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(out,", {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," __type = \'");
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"\'");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"})");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"function ");
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,":process(iprot, oprot, server_ctx)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"local name, mtype, seqid = iprot:readMessageBegin()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"local func_name = \'process_\' .. name");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           "if not self[func_name] or ttype(self[func_name]) ~= \'function\' then");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"if oprot ~= nil then");
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"iprot:skip(TType.STRUCT)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"iprot:readMessageEnd()");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"x = TApplicationException:new{");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_68);
  poVar4 = std::operator<<(poVar4,"  errorCode = TApplicationException.UNKNOWN_METHOD");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_a8);
  poVar4 = std::operator<<(poVar4,"oprot:writeMessageBegin(name, TMessageType.EXCEPTION, ");
  poVar4 = std::operator<<(poVar4,"seqid)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,"x:write(oprot)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_e8);
  poVar4 = std::operator<<(poVar4,"oprot:writeMessageEnd()");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_108);
  poVar4 = std::operator<<(poVar4,"oprot.trans:flush()");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"return false, \'Unknown function \'..name");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"else");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"  return self[func_name](self, seqid, iprot, oprot, server_ctx)")
  ;
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_168,&tservice->functions_
            );
  for (_Var6._M_p = local_168._M_dataplus._M_p; _Var6._M_p != (pointer)local_168._M_string_length;
      _Var6._M_p = _Var6._M_p + 8) {
    generate_process_function(this,out,tservice,*(t_function **)_Var6._M_p);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            ((_Vector_base<t_function_*,_std::allocator<t_function_*>_> *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void t_lua_generator::generate_service_processor(ostream& out, t_service* tservice) {
  string classname = tservice->get_name() + "Processor";
  t_service* extends_s = tservice->get_extends();

  // Define processor table
  out << endl << classname << " = __TObject.new(";
  if (extends_s != nullptr) {
    out << extends_s->get_name() << "Processor" << endl;
  } else {
    out << "__TProcessor" << endl;
  }
  out << ", {" << endl << " __type = '" << classname << "'" << endl << "})" << endl;

  // Process function
  indent(out) << endl << "function " << classname << ":process(iprot, oprot, server_ctx)" << endl;
  indent_up();

  indent(out) << "local name, mtype, seqid = iprot:readMessageBegin()" << endl;
  indent(out) << "local func_name = 'process_' .. name" << endl;
  indent(out) << "if not self[func_name] or ttype(self[func_name]) ~= 'function' then" << endl;
  indent_up();
  indent(out) << "if oprot ~= nil then";
  indent_up();
  out << endl << indent() << "iprot:skip(TType.STRUCT)" << endl << indent()
      << "iprot:readMessageEnd()" << endl << indent() << "x = TApplicationException:new{" << endl
      << indent() << "  errorCode = TApplicationException.UNKNOWN_METHOD" << endl << indent() << "}"
      << endl << indent() << "oprot:writeMessageBegin(name, TMessageType.EXCEPTION, "
      << "seqid)" << endl << indent() << "x:write(oprot)" << endl << indent()
      << "oprot:writeMessageEnd()" << endl << indent() << "oprot.trans:flush()" << endl;
  indent_down();
  out << indent() << "end" << endl << indent()
      << "return false, 'Unknown function '..name" << endl;
  indent_down();
  indent(out) << "else" << endl << indent()
              << "  return self[func_name](self, seqid, iprot, oprot, server_ctx)" << endl << indent()
              << "end" << endl;

  indent_down();
  indent(out) << "end" << endl;

  // Generate the process subfunctions
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(out, tservice, *f_iter);
  }
}